

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::LimitingInputStream::Skip(LimitingInputStream *this,int count)

{
  uint uVar1;
  int count_local;
  LimitingInputStream *this_local;
  
  if (this->limit_ < (long)count) {
    if (this->limit_ < 0) {
      this_local._7_1_ = false;
    }
    else {
      (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,this->limit_ & 0xffffffff);
      this->limit_ = 0;
      this_local._7_1_ = false;
    }
  }
  else {
    uVar1 = (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)(uint)count);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->limit_ = this->limit_ - (long)count;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LimitingInputStream::Skip(int count) {
  if (count > limit_) {
    if (limit_ < 0) return false;
    input_->Skip(limit_);
    limit_ = 0;
    return false;
  } else {
    if (!input_->Skip(count)) return false;
    limit_ -= count;
    return true;
  }
}